

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffsparser.cpp
# Opt level: O0

USTATUS __thiscall
FfsParser::parseCpdExtensionsArea(FfsParser *this,UModelIndex *index,UINT32 localOffset)

{
  TreeModel *pTVar1;
  bool bVar2;
  uint uVar3;
  int32_t iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  UINT32 UVar8;
  char *pcVar9;
  UINT32 *pUVar10;
  uint *puVar11;
  CBString local_6a0;
  UByteArray local_688;
  UByteArray local_668;
  CBString local_648;
  UModelIndex local_630;
  UByteArray local_618;
  UByteArray local_5f8;
  CBString local_5d8;
  UModelIndex local_5c0;
  UByteArray local_5a8;
  CBString local_588;
  CBString local_570;
  CBString local_558;
  char *local_540;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_538;
  undefined1 local_530 [8];
  UByteArray hash_1;
  int hashSize_1;
  CPD_EXT_MODULE_ATTRIBUTES *attrHeader_1;
  UByteArray local_4e8;
  UByteArray local_4c8;
  CBString local_4a8;
  UModelIndex local_490;
  UByteArray local_478;
  CBString local_458;
  CBString local_440;
  CBString local_428;
  CBString local_410;
  CBString local_3f8;
  CBString local_3e0;
  CBString local_3c8;
  CBString local_3b0;
  CBString local_398;
  CBString local_380;
  CBString local_368;
  CBString local_350;
  CBString local_338;
  CBString local_320;
  CBString local_308;
  CBString local_2f0;
  CBString local_2d8;
  CBString local_2c0;
  CBString local_2a8;
  CBString local_290;
  CBString local_278;
  CBString local_260;
  CBString local_248;
  CBString local_230;
  CBString local_218;
  CBString local_200;
  char *local_1e8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1e0;
  undefined1 local_1d8 [8];
  UByteArray hash;
  bool msgHashSizeMismatch;
  UINT32 hashSize;
  CPD_EXT_IFWI_PARTITION_MANIFEST *attrHeader;
  CBString local_188;
  UModelIndex local_170;
  CBString local_158;
  char *local_140;
  CPD_EXT_SIGNED_PACKAGE_INFO *infoHeader;
  UByteArray data;
  UByteArray header;
  UModelIndex extIndex;
  CBString info;
  CBString name;
  UByteArray partition;
  CPD_EXTENTION_HEADER *extHeader;
  uint local_74;
  undefined1 local_70 [4];
  UINT32 offset;
  UByteArray body;
  UINT32 localOffset_local;
  UModelIndex *index_local;
  FfsParser *this_local;
  
  body.d.field_2._12_4_ = localOffset;
  bVar2 = UModelIndex::isValid(index);
  if (bVar2) {
    TreeModel::body((UByteArray *)local_70,this->model,index);
    local_74 = 0;
    while (uVar3 = UByteArray::size((UByteArray *)local_70), local_74 < uVar3) {
      pcVar9 = UByteArray::constData((UByteArray *)local_70);
      pUVar10 = (UINT32 *)(pcVar9 + local_74);
      if ((pUVar10[1] == 0) ||
         (uVar3 = pUVar10[1], iVar4 = UByteArray::size((UByteArray *)local_70),
         iVar4 - local_74 < uVar3)) break;
      UByteArray::mid((UByteArray *)&name.super_tagbstring.data,(UByteArray *)local_70,local_74,
                      pUVar10[1]);
      cpdExtensionTypeToUstring((CBString *)&info.super_tagbstring.data,*pUVar10);
      uVar3 = UByteArray::size((UByteArray *)&name.super_tagbstring.data);
      uVar5 = UByteArray::size((UByteArray *)&name.super_tagbstring.data);
      usprintf((CBString *)&extIndex.m,"Full size: %Xh (%u)\nType: %Xh",(ulong)uVar3,(ulong)uVar5);
      UModelIndex::UModelIndex((UModelIndex *)((long)&header.d.field_2 + 8));
      if (*pUVar10 == 0xf) {
        UByteArray::left((UByteArray *)((long)&data.d.field_2 + 8),
                         (UByteArray *)&name.super_tagbstring.data,0x34);
        iVar4 = UByteArray::size((UByteArray *)((long)&data.d.field_2 + 8));
        UByteArray::mid((UByteArray *)&infoHeader,(UByteArray *)&name.super_tagbstring.data,iVar4,-1
                       );
        local_140 = UByteArray::constData((UByteArray *)((long)&data.d.field_2 + 8));
        uVar3 = UByteArray::size((UByteArray *)&name.super_tagbstring.data);
        uVar5 = UByteArray::size((UByteArray *)&name.super_tagbstring.data);
        uVar6 = UByteArray::size((UByteArray *)((long)&data.d.field_2 + 8));
        uVar7 = UByteArray::size((UByteArray *)((long)&data.d.field_2 + 8));
        UByteArray::size((UByteArray *)local_70);
        UByteArray::size((UByteArray *)local_70);
        usprintf(&local_158,
                 "Full size: %Xh (%u)\nHeader size: %Xh (%u)\nBody size: %Xh (%u)\nType: %Xh\nPackage name: %.4s\nVersion control number: %Xh\nSecurity version number: %Xh\nUsage bitmap: %02X%02X%02X%02X%02X%02X%02X%02X%02X%02X%02X%02X%02X%02X%02X%02X"
                 ,(ulong)uVar3,(ulong)uVar5,(ulong)uVar6,(ulong)uVar7);
        Bstrlib::CBString::operator=((CBString *)&extIndex.m,&local_158);
        Bstrlib::CBString::~CBString(&local_158);
        pTVar1 = this->model;
        UVar8 = local_74 + body.d.field_2._12_4_;
        Bstrlib::CBString::CBString(&local_188);
        UByteArray::UByteArray((UByteArray *)&attrHeader);
        TreeModel::addItem(&local_170,pTVar1,UVar8,'b','\0',(CBString *)&info.super_tagbstring.data,
                           &local_188,(CBString *)&extIndex.m,
                           (UByteArray *)((long)&data.d.field_2 + 8),(UByteArray *)&infoHeader,
                           (UByteArray *)&attrHeader,Fixed,index,'\0');
        extIndex.i = (uint64_t)local_170.m;
        header.d.field_2._8_4_ = local_170.r;
        header.d.field_2._12_4_ = local_170.c;
        extIndex.r = (undefined4)local_170.i;
        extIndex.c = local_170.i._4_4_;
        UByteArray::~UByteArray((UByteArray *)&attrHeader);
        Bstrlib::CBString::~CBString(&local_188);
        parseSignedPackageInfoData(this,(UModelIndex *)((long)&header.d.field_2 + 8));
        UByteArray::~UByteArray((UByteArray *)&infoHeader);
        UByteArray::~UByteArray((UByteArray *)((long)&data.d.field_2 + 8));
      }
      else if (*pUVar10 == 0x16) {
        puVar11 = (uint *)UByteArray::constData((UByteArray *)&name.super_tagbstring.data);
        hash.d.field_2._12_4_ = (undefined4)((ulong)*(undefined8 *)(puVar11 + 7) >> 0x28);
        hash.d.field_2._M_local_buf[0xb] = 0x30 < (uint)hash.d.field_2._12_4_;
        if ((bool)hash.d.field_2._M_local_buf[0xb]) {
          hash.d.field_2._12_4_ = 0x30;
        }
        UByteArray::UByteArray((UByteArray *)local_1d8,(char *)(puVar11 + 9),hash.d.field_2._12_4_);
        local_1e0._M_current = (char *)UByteArray::begin_abi_cxx11_((UByteArray *)local_1d8);
        local_1e8 = (char *)UByteArray::end_abi_cxx11_((UByteArray *)local_1d8);
        std::reverse<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                  (local_1e0,
                   (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )local_1e8);
        uVar3 = UByteArray::size((UByteArray *)&name.super_tagbstring.data);
        uVar5 = UByteArray::size((UByteArray *)&name.super_tagbstring.data);
        usprintf(&local_380,
                 "Full size: %Xh (%u)\nType: %Xh\nPartition name: %.4s\nPartition length: %Xh\nPartition version major: %Xh\nPartition version minor: %Xh\nData format version: %Xh\nInstance ID: %Xh\nHash algorithm: %Xh\nHash size: %Xh\nAction on update: %Xh"
                 ,(ulong)uVar3,(ulong)uVar5,(ulong)*puVar11,puVar11 + 2);
        Bstrlib::CBString::CBString(&local_398,"\nSupport multiple instances: ");
        Bstrlib::CBString::operator+(&local_368,&local_380,&local_398);
        pcVar9 = "No";
        if ((puVar11[7] & 1) != 0) {
          pcVar9 = "Yes";
        }
        Bstrlib::CBString::operator+(&local_350,&local_368,pcVar9);
        Bstrlib::CBString::CBString(&local_3b0,"\nSupport API version based update: ");
        Bstrlib::CBString::operator+(&local_338,&local_350,&local_3b0);
        pcVar9 = "No";
        if (((byte)puVar11[7] >> 1 & 1) != 0) {
          pcVar9 = "Yes";
        }
        Bstrlib::CBString::operator+(&local_320,&local_338,pcVar9);
        Bstrlib::CBString::CBString(&local_3c8,"\nObey full update rules: ");
        Bstrlib::CBString::operator+(&local_308,&local_320,&local_3c8);
        pcVar9 = "No";
        if (((byte)puVar11[7] >> 4 & 1) != 0) {
          pcVar9 = "Yes";
        }
        Bstrlib::CBString::operator+(&local_2f0,&local_308,pcVar9);
        Bstrlib::CBString::CBString(&local_3e0,"\nIFR enable only: ");
        Bstrlib::CBString::operator+(&local_2d8,&local_2f0,&local_3e0);
        pcVar9 = "No";
        if (((byte)puVar11[7] >> 5 & 1) != 0) {
          pcVar9 = "Yes";
        }
        Bstrlib::CBString::operator+(&local_2c0,&local_2d8,pcVar9);
        Bstrlib::CBString::CBString(&local_3f8,"\nAllow cross point update: ");
        Bstrlib::CBString::operator+(&local_2a8,&local_2c0,&local_3f8);
        pcVar9 = "No";
        if (((byte)puVar11[7] >> 6 & 1) != 0) {
          pcVar9 = "Yes";
        }
        Bstrlib::CBString::operator+(&local_290,&local_2a8,pcVar9);
        Bstrlib::CBString::CBString(&local_410,"\nAllow cross hotfix update: ");
        Bstrlib::CBString::operator+(&local_278,&local_290,&local_410);
        pcVar9 = "No";
        if ((puVar11[7] & 0x80) != 0) {
          pcVar9 = "Yes";
        }
        Bstrlib::CBString::operator+(&local_260,&local_278,pcVar9);
        Bstrlib::CBString::CBString(&local_428,"\nPartial update only: ");
        Bstrlib::CBString::operator+(&local_248,&local_260,&local_428);
        pcVar9 = "No";
        if ((*(byte *)((long)puVar11 + 0x1d) & 1) != 0) {
          pcVar9 = "Yes";
        }
        Bstrlib::CBString::operator+(&local_230,&local_248,pcVar9);
        Bstrlib::CBString::CBString(&local_440,"\nPartition hash: ");
        Bstrlib::CBString::operator+(&local_218,&local_230,&local_440);
        UByteArray::toHex(&local_478,(UByteArray *)local_1d8);
        pcVar9 = UByteArray::constData(&local_478);
        Bstrlib::CBString::CBString(&local_458,pcVar9);
        Bstrlib::CBString::operator+(&local_200,&local_218,&local_458);
        Bstrlib::CBString::operator=((CBString *)&extIndex.m,&local_200);
        Bstrlib::CBString::~CBString(&local_200);
        Bstrlib::CBString::~CBString(&local_458);
        UByteArray::~UByteArray(&local_478);
        Bstrlib::CBString::~CBString(&local_218);
        Bstrlib::CBString::~CBString(&local_440);
        Bstrlib::CBString::~CBString(&local_230);
        Bstrlib::CBString::~CBString(&local_248);
        Bstrlib::CBString::~CBString(&local_428);
        Bstrlib::CBString::~CBString(&local_260);
        Bstrlib::CBString::~CBString(&local_278);
        Bstrlib::CBString::~CBString(&local_410);
        Bstrlib::CBString::~CBString(&local_290);
        Bstrlib::CBString::~CBString(&local_2a8);
        Bstrlib::CBString::~CBString(&local_3f8);
        Bstrlib::CBString::~CBString(&local_2c0);
        Bstrlib::CBString::~CBString(&local_2d8);
        Bstrlib::CBString::~CBString(&local_3e0);
        Bstrlib::CBString::~CBString(&local_2f0);
        Bstrlib::CBString::~CBString(&local_308);
        Bstrlib::CBString::~CBString(&local_3c8);
        Bstrlib::CBString::~CBString(&local_320);
        Bstrlib::CBString::~CBString(&local_338);
        Bstrlib::CBString::~CBString(&local_3b0);
        Bstrlib::CBString::~CBString(&local_350);
        Bstrlib::CBString::~CBString(&local_368);
        Bstrlib::CBString::~CBString(&local_398);
        Bstrlib::CBString::~CBString(&local_380);
        pTVar1 = this->model;
        UVar8 = local_74 + body.d.field_2._12_4_;
        Bstrlib::CBString::CBString(&local_4a8);
        UByteArray::UByteArray(&local_4c8);
        UByteArray::UByteArray(&local_4e8);
        TreeModel::addItem(&local_490,pTVar1,UVar8,'b','\0',(CBString *)&info.super_tagbstring.data,
                           &local_4a8,(CBString *)&extIndex.m,&local_4c8,
                           (UByteArray *)&name.super_tagbstring.data,&local_4e8,Fixed,index,'\0');
        header.d.field_2._8_4_ = local_490.r;
        header.d.field_2._12_4_ = local_490.c;
        extIndex.r = (undefined4)local_490.i;
        extIndex.c = local_490.i._4_4_;
        extIndex.i = (uint64_t)local_490.m;
        UByteArray::~UByteArray(&local_4e8);
        UByteArray::~UByteArray(&local_4c8);
        Bstrlib::CBString::~CBString(&local_4a8);
        if ((hash.d.field_2._M_local_buf[0xb] & 1U) != 0) {
          usprintf((CBString *)&attrHeader_1,
                   "%s: IFWI Partition Manifest hash size is %u, maximum allowed is %u, truncated",
                   "parseCpdExtensionsArea",*(ulong *)(puVar11 + 7) >> 0x28,0x30);
          msg(this,(CBString *)&attrHeader_1,(UModelIndex *)((long)&header.d.field_2 + 8));
          Bstrlib::CBString::~CBString((CBString *)&attrHeader_1);
        }
        UByteArray::~UByteArray((UByteArray *)local_1d8);
      }
      else if (*pUVar10 == 10) {
        puVar11 = (uint *)UByteArray::constData((UByteArray *)&name.super_tagbstring.data);
        iVar4 = UByteArray::size((UByteArray *)&name.super_tagbstring.data);
        hash_1.d.field_2._12_4_ = iVar4 + -0x18;
        UByteArray::UByteArray
                  ((UByteArray *)local_530,(char *)(puVar11 + 6),hash_1.d.field_2._12_4_);
        local_538._M_current = (char *)UByteArray::begin_abi_cxx11_((UByteArray *)local_530);
        local_540 = (char *)UByteArray::end_abi_cxx11_((UByteArray *)local_530);
        std::reverse<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                  (local_538,
                   (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )local_540);
        uVar3 = UByteArray::size((UByteArray *)&name.super_tagbstring.data);
        uVar5 = UByteArray::size((UByteArray *)&name.super_tagbstring.data);
        usprintf(&local_570,
                 "Full size: %Xh (%u)\nType: %Xh\nCompression type: %Xh\nUncompressed size: %Xh (%u)\nCompressed size: %Xh (%u)\nGlobal module ID: %Xh\nImage hash: "
                 ,(ulong)uVar3,(ulong)uVar5,(ulong)*puVar11,(ulong)puVar11[2]);
        UByteArray::toHex(&local_5a8,(UByteArray *)local_530);
        pcVar9 = UByteArray::constData(&local_5a8);
        Bstrlib::CBString::CBString(&local_588,pcVar9);
        Bstrlib::CBString::operator+(&local_558,&local_570,&local_588);
        Bstrlib::CBString::operator=((CBString *)&extIndex.m,&local_558);
        Bstrlib::CBString::~CBString(&local_558);
        Bstrlib::CBString::~CBString(&local_588);
        UByteArray::~UByteArray(&local_5a8);
        Bstrlib::CBString::~CBString(&local_570);
        pTVar1 = this->model;
        UVar8 = local_74 + body.d.field_2._12_4_;
        Bstrlib::CBString::CBString(&local_5d8);
        UByteArray::UByteArray(&local_5f8);
        UByteArray::UByteArray(&local_618);
        TreeModel::addItem(&local_5c0,pTVar1,UVar8,'b','\0',(CBString *)&info.super_tagbstring.data,
                           &local_5d8,(CBString *)&extIndex.m,&local_5f8,
                           (UByteArray *)&name.super_tagbstring.data,&local_618,Fixed,index,'\0');
        header.d.field_2._8_4_ = local_5c0.r;
        header.d.field_2._12_4_ = local_5c0.c;
        extIndex.r = (undefined4)local_5c0.i;
        extIndex.c = local_5c0.i._4_4_;
        extIndex.i = (uint64_t)local_5c0.m;
        UByteArray::~UByteArray(&local_618);
        UByteArray::~UByteArray(&local_5f8);
        Bstrlib::CBString::~CBString(&local_5d8);
        UByteArray::~UByteArray((UByteArray *)local_530);
      }
      else {
        pTVar1 = this->model;
        UVar8 = local_74 + body.d.field_2._12_4_;
        Bstrlib::CBString::CBString(&local_648);
        UByteArray::UByteArray(&local_668);
        UByteArray::UByteArray(&local_688);
        TreeModel::addItem(&local_630,pTVar1,UVar8,'b','\0',(CBString *)&info.super_tagbstring.data,
                           &local_648,(CBString *)&extIndex.m,&local_668,
                           (UByteArray *)&name.super_tagbstring.data,&local_688,Fixed,index,'\0');
        header.d.field_2._8_4_ = local_630.r;
        header.d.field_2._12_4_ = local_630.c;
        extIndex.r = (undefined4)local_630.i;
        extIndex.c = local_630.i._4_4_;
        extIndex.i = (uint64_t)local_630.m;
        UByteArray::~UByteArray(&local_688);
        UByteArray::~UByteArray(&local_668);
        Bstrlib::CBString::~CBString(&local_648);
      }
      if ((((0x1a < *pUVar10) && (*pUVar10 != 0x1e)) && (*pUVar10 != 0x1f)) &&
         (((*pUVar10 != 0x22 && (*pUVar10 != 0x23)) && (*pUVar10 != 0x32)))) {
        usprintf(&local_6a0,"%s: CPD extension of unknown type found","parseCpdExtensionsArea");
        msg(this,&local_6a0,(UModelIndex *)((long)&header.d.field_2 + 8));
        Bstrlib::CBString::~CBString(&local_6a0);
      }
      local_74 = pUVar10[1] + local_74;
      Bstrlib::CBString::~CBString((CBString *)&extIndex.m);
      Bstrlib::CBString::~CBString((CBString *)&info.super_tagbstring.data);
      UByteArray::~UByteArray((UByteArray *)&name.super_tagbstring.data);
    }
    this_local = (FfsParser *)0x0;
    UByteArray::~UByteArray((UByteArray *)local_70);
  }
  else {
    this_local = (FfsParser *)0x1;
  }
  return (USTATUS)this_local;
}

Assistant:

USTATUS FfsParser::parseCpdExtensionsArea(const UModelIndex & index, const UINT32 localOffset)
{
    if (!index.isValid()) {
        return U_INVALID_PARAMETER;
    }
    
    UByteArray body = model->body(index);
    UINT32 offset = 0;
    while (offset < (UINT32)body.size()) {
        const CPD_EXTENTION_HEADER* extHeader = (const CPD_EXTENTION_HEADER*) (body.constData() + offset);
        if (extHeader->Length > 0
            && extHeader->Length <= ((UINT32)body.size() - offset)) {
            UByteArray partition = body.mid(offset, extHeader->Length);
            
            UString name = cpdExtensionTypeToUstring(extHeader->Type);
            UString info = usprintf("Full size: %Xh (%u)\nType: %Xh", (UINT32)partition.size(), (UINT32)partition.size(), extHeader->Type);
            
            // Parse Signed Package Info a bit further
            UModelIndex extIndex;
            if (extHeader->Type == CPD_EXT_TYPE_SIGNED_PACKAGE_INFO) {
                UByteArray header = partition.left(sizeof(CPD_EXT_SIGNED_PACKAGE_INFO));
                UByteArray data = partition.mid(header.size());
                
                const CPD_EXT_SIGNED_PACKAGE_INFO* infoHeader = (const CPD_EXT_SIGNED_PACKAGE_INFO*)header.constData();
                
                info = usprintf("Full size: %Xh (%u)\nHeader size: %Xh (%u)\nBody size: %Xh (%u)\nType: %Xh\n"
                                "Package name: %.4s\nVersion control number: %Xh\nSecurity version number: %Xh\n"
                                "Usage bitmap: %02X%02X%02X%02X%02X%02X%02X%02X%02X%02X%02X%02X%02X%02X%02X%02X",
                                (UINT32)partition.size(), (UINT32)partition.size(),
                                (UINT32)header.size(), (UINT32)header.size(),
                                (UINT32)body.size(), (UINT32)body.size(),
                                infoHeader->ExtensionType,
                                infoHeader->PackageName,
                                infoHeader->Vcn,
                                infoHeader->Svn,
                                infoHeader->UsageBitmap[0],  infoHeader->UsageBitmap[1],  infoHeader->UsageBitmap[2],  infoHeader->UsageBitmap[3],
                                infoHeader->UsageBitmap[4],  infoHeader->UsageBitmap[5],  infoHeader->UsageBitmap[6],  infoHeader->UsageBitmap[7],
                                infoHeader->UsageBitmap[8],  infoHeader->UsageBitmap[9],  infoHeader->UsageBitmap[10], infoHeader->UsageBitmap[11],
                                infoHeader->UsageBitmap[12], infoHeader->UsageBitmap[13], infoHeader->UsageBitmap[14], infoHeader->UsageBitmap[15]);
                
                // Add tree item
                extIndex = model->addItem(offset + localOffset, Types::CpdExtension, 0, name, UString(), info, header, data, UByteArray(), Fixed, index);
                parseSignedPackageInfoData(extIndex);
            }
            // Parse IFWI Partition Manifest a bit further
            else if (extHeader->Type == CPD_EXT_TYPE_IFWI_PARTITION_MANIFEST) {
                const CPD_EXT_IFWI_PARTITION_MANIFEST* attrHeader = (const CPD_EXT_IFWI_PARTITION_MANIFEST*)partition.constData();
                
                // Check HashSize to be sane.
                UINT32 hashSize = attrHeader->HashSize;
                bool msgHashSizeMismatch = false;
                if (hashSize > sizeof(attrHeader->CompletePartitionHash)) {
                    hashSize = sizeof(attrHeader->CompletePartitionHash);
                    msgHashSizeMismatch = true;
                }
                
                // This hash is stored reversed
                // Need to reverse it back to normal
                UByteArray hash((const char*)&attrHeader->CompletePartitionHash, hashSize);
                std::reverse(hash.begin(), hash.end());
                
                info = usprintf("Full size: %Xh (%u)\nType: %Xh\n"
                                "Partition name: %.4s\nPartition length: %Xh\nPartition version major: %Xh\nPartition version minor: %Xh\n"
                                "Data format version: %Xh\nInstance ID: %Xh\nHash algorithm: %Xh\nHash size: %Xh\nAction on update: %Xh",
                                (UINT32)partition.size(), (UINT32)partition.size(),
                                attrHeader->ExtensionType,
                                attrHeader->PartitionName,
                                attrHeader->CompletePartitionLength,
                                attrHeader->PartitionVersionMajor, attrHeader->PartitionVersionMinor,
                                attrHeader->DataFormatVersion,
                                attrHeader->InstanceId,
                                attrHeader->HashAlgorithm,
                                attrHeader->HashSize,
                                attrHeader->ActionOnUpdate)
                + UString("\nSupport multiple instances: ") + (attrHeader->SupportMultipleInstances ? "Yes" : "No")
                + UString("\nSupport API version based update: ") + (attrHeader->SupportApiVersionBasedUpdate ? "Yes" : "No")
                + UString("\nObey full update rules: ") + (attrHeader->ObeyFullUpdateRules ? "Yes" : "No")
                + UString("\nIFR enable only: ") + (attrHeader->IfrEnableOnly ? "Yes" : "No")
                + UString("\nAllow cross point update: ") + (attrHeader->AllowCrossPointUpdate ? "Yes" : "No")
                + UString("\nAllow cross hotfix update: ") + (attrHeader->AllowCrossHotfixUpdate ? "Yes" : "No")
                + UString("\nPartial update only: ") + (attrHeader->PartialUpdateOnly ? "Yes" : "No")
                + UString("\nPartition hash: ") +  UString(hash.toHex().constData());
                
                // Add tree item
                extIndex = model->addItem(offset + localOffset, Types::CpdExtension, 0, name, UString(), info, UByteArray(), partition, UByteArray(), Fixed, index);
                if (msgHashSizeMismatch) {
                    msg(usprintf("%s: IFWI Partition Manifest hash size is %u, maximum allowed is %u, truncated", __FUNCTION__, attrHeader->HashSize, (UINT32)sizeof(attrHeader->CompletePartitionHash)), extIndex);
                }
            }
            // Parse Module Attributes a bit further
            else if (extHeader->Type == CPD_EXT_TYPE_MODULE_ATTRIBUTES) {
                const CPD_EXT_MODULE_ATTRIBUTES* attrHeader = (const CPD_EXT_MODULE_ATTRIBUTES*)partition.constData();
                int hashSize = (UINT32)partition.size() - CpdExtModuleImageHashOffset;
                
                // This hash is stored reversed
                // Need to reverse it back to normal
                UByteArray hash((const char*)attrHeader + CpdExtModuleImageHashOffset, hashSize);
                std::reverse(hash.begin(), hash.end());
                
                info = usprintf("Full size: %Xh (%u)\nType: %Xh\n"
                                "Compression type: %Xh\nUncompressed size: %Xh (%u)\nCompressed size: %Xh (%u)\nGlobal module ID: %Xh\nImage hash: ",
                                (UINT32)partition.size(), (UINT32)partition.size(),
                                attrHeader->ExtensionType,
                                attrHeader->CompressionType,
                                attrHeader->UncompressedSize, attrHeader->UncompressedSize,
                                attrHeader->CompressedSize, attrHeader->CompressedSize,
                                attrHeader->GlobalModuleId) + UString(hash.toHex().constData());
                
                // Add tree item
                extIndex = model->addItem(offset + localOffset, Types::CpdExtension, 0, name, UString(), info, UByteArray(), partition, UByteArray(), Fixed, index);
            }
            // Parse everything else
            else {
                // Add tree item, if needed
                extIndex = model->addItem(offset + localOffset, Types::CpdExtension, 0, name, UString(), info, UByteArray(), partition, UByteArray(), Fixed, index);
            }
            
            // There needs to be a more generic way to do it, but it is fine for now
            if (extHeader->Type > CPD_EXT_TYPE_TBT_METADATA
                && extHeader->Type != CPD_EXT_TYPE_GMF_CERTIFICATE
                && extHeader->Type != CPD_EXT_TYPE_GMF_BODY
                && extHeader->Type != CPD_EXT_TYPE_KEY_MANIFEST_EXT
                && extHeader->Type != CPD_EXT_TYPE_SIGNED_PACKAGE_INFO_EXT
                && extHeader->Type != CPD_EXT_TYPE_SPS_PLATFORM_ID) {
                msg(usprintf("%s: CPD extension of unknown type found", __FUNCTION__), extIndex);
            }
            
            offset += extHeader->Length;
        }
        else break;
        // TODO: add padding at the end
    }
    
    return U_SUCCESS;
}